

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O2

void __thiscall restincurl::Request::CallCompletion(Request *this,CURLcode cc)

{
  ostream *poVar1;
  Result result;
  CURLcode local_64;
  undefined1 local_60 [80];
  
  local_64 = cc;
  Result::Result((Result *)local_60,&local_64);
  curl_easy_getinfo(((this->eh_)._M_t.
                     super___uniq_ptr_impl<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_restincurl::EasyHandle_*,_std::default_delete<restincurl::EasyHandle>_>
                     .super__Head_base<0UL,_restincurl::EasyHandle_*,_false>._M_head_impl)->handle_,
                    0x200002,local_60 + 8);
  poVar1 = std::operator<<((ostream *)&std::clog,"Complete: http code: ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  if ((this->completion_).super__Function_base._M_manager != (_Manager_type)0x0) {
    if ((this->default_data_buffer_)._M_string_length != 0) {
      std::__cxx11::string::operator=
                ((string *)(local_60 + 0x30),(string *)&this->default_data_buffer_);
    }
    std::function<void_(const_restincurl::Result_&)>::operator()
              (&this->completion_,(Result *)local_60);
  }
  Result::~Result((Result *)local_60);
  return;
}

Assistant:

void CallCompletion(CURLcode cc) {
            Result result(cc);

            curl_easy_getinfo (*eh_, CURLINFO_RESPONSE_CODE,
                               &result.http_response_code);
            RESTINCURL_LOG("Complete: http code: " << result.http_response_code);
            if (completion_) {
                if (!default_data_buffer_.empty()) {
                    result.body = std::move(default_data_buffer_);
                }
                completion_(result);
            }
        }